

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__info_main(stbi__context *s,int *x,int *y,int *comp)

{
  int iVar1;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  stbi__context *in_RDI;
  int *in_stack_00000020;
  stbi__context *in_stack_00000028;
  int *in_stack_000003e0;
  int *in_stack_000003e8;
  int *in_stack_000003f0;
  stbi__context *in_stack_000003f8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = stbi__jpeg_info((stbi__context *)comp,
                          (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (int *)in_RDI,in_RSI);
  if (iVar1 == 0) {
    iVar1 = stbi__png_info((stbi__context *)x,y,comp,
                           (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar1 == 0) {
      iVar1 = stbi__gif_info(in_RDI,in_RSI,in_RDX,in_RCX);
      if (iVar1 == 0) {
        iVar1 = stbi__bmp_info(s,x,y,comp);
        if (iVar1 == 0) {
          iVar1 = stbi__psd_info((stbi__context *)
                                 CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                 (int *)in_RDI,in_RSI,in_RDX);
          if (iVar1 == 0) {
            iVar1 = stbi__pic_info(in_stack_00000028,in_stack_00000020,(int *)s,x);
            if (iVar1 == 0) {
              iVar1 = stbi__pnm_info((stbi__context *)
                                     CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                     (int *)in_RDI,in_RSI,in_RDX);
              if (iVar1 == 0) {
                iVar1 = stbi__hdr_info(in_stack_000003f8,in_stack_000003f0,in_stack_000003e8,
                                       in_stack_000003e0);
                if (iVar1 == 0) {
                  iVar1 = stbi__tga_info(s,x,y,comp);
                  if (iVar1 == 0) {
                    iVar1 = stbi__err("unknown image type");
                  }
                  else {
                    iVar1 = 1;
                  }
                }
                else {
                  iVar1 = 1;
                }
              }
              else {
                iVar1 = 1;
              }
            }
            else {
              iVar1 = 1;
            }
          }
          else {
            iVar1 = 1;
          }
        }
        else {
          iVar1 = 1;
        }
      }
      else {
        iVar1 = 1;
      }
    }
    else {
      iVar1 = 1;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbi__info_main(stbi__context *s, int *x, int *y, int *comp)
{
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_info(s, x, y, comp)) return 1;
   #endif

   #ifndef STBI_NO_PNG
   if (stbi__png_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_GIF
   if (stbi__gif_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_BMP
   if (stbi__bmp_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PIC
   if (stbi__pic_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_info(s, x, y, comp))  return 1;
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_info(s, x, y, comp))  return 1;
   #endif

   // test tga last because it's a crappy test!
   #ifndef STBI_NO_TGA
   if (stbi__tga_info(s, x, y, comp))
       return 1;
   #endif
   return stbi__err("unknown image type", "Image not of any known type, or corrupt");
}